

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O0

void UpdateHistogramCost(VP8LHistogram *h)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  long *in_RDI;
  uint32_t *unaff_retaddr;
  int in_stack_0000000c;
  uint32_t *in_stack_00000010;
  int num_codes;
  uint64_t distance_cost;
  uint64_t alpha_cost;
  uint32_t blue_sym;
  uint32_t red_sym;
  uint32_t alpha_sym;
  uint local_14;
  uint local_10;
  uint local_c;
  
  uVar3 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  uVar4 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  uVar1 = (*VP8LExtraCost)((uint32_t *)(in_RDI + 0x181),0x28);
  VP8LHistogramNumCodes((int)in_RDI[0x195]);
  uVar5 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  uVar2 = (*VP8LExtraCost)((uint32_t *)(*in_RDI + 0x400),0x18);
  in_RDI[0x197] = uVar5 + (ulong)uVar2 * 0x800000;
  uVar5 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  in_RDI[0x198] = uVar5;
  uVar5 = PopulationCost(in_stack_00000010,in_stack_0000000c,unaff_retaddr,(uint8_t *)in_RDI);
  in_RDI[0x199] = uVar5;
  in_RDI[0x196] =
       in_RDI[0x197] + in_RDI[0x198] + in_RDI[0x199] + uVar3 + uVar4 + (ulong)uVar1 * 0x800000;
  if ((local_c | local_10 | local_14) == 0xffffffff) {
    *(undefined4 *)((long)in_RDI + 0xcac) = 0xffffffff;
  }
  else {
    *(uint *)((long)in_RDI + 0xcac) = local_c << 0x18 | local_10 << 0x10 | local_14;
  }
  return;
}

Assistant:

static void UpdateHistogramCost(VP8LHistogram* const h) {
  uint32_t alpha_sym, red_sym, blue_sym;
  const uint64_t alpha_cost =
      PopulationCost(h->alpha_, NUM_LITERAL_CODES, &alpha_sym, &h->is_used_[3]);
  const uint64_t distance_cost =
      PopulationCost(h->distance_, NUM_DISTANCE_CODES, NULL, &h->is_used_[4]) +
      ((uint64_t)VP8LExtraCost(h->distance_, NUM_DISTANCE_CODES)
       << LOG_2_PRECISION_BITS);
  const int num_codes = VP8LHistogramNumCodes(h->palette_code_bits_);
  h->literal_cost_ =
      PopulationCost(h->literal_, num_codes, NULL, &h->is_used_[0]) +
      ((uint64_t)VP8LExtraCost(h->literal_ + NUM_LITERAL_CODES,
                               NUM_LENGTH_CODES)
       << LOG_2_PRECISION_BITS);
  h->red_cost_ =
      PopulationCost(h->red_, NUM_LITERAL_CODES, &red_sym, &h->is_used_[1]);
  h->blue_cost_ =
      PopulationCost(h->blue_, NUM_LITERAL_CODES, &blue_sym, &h->is_used_[2]);
  h->bit_cost_ = h->literal_cost_ + h->red_cost_ + h->blue_cost_ +
                 alpha_cost + distance_cost;
  if ((alpha_sym | red_sym | blue_sym) == VP8L_NON_TRIVIAL_SYM) {
    h->trivial_symbol_ = VP8L_NON_TRIVIAL_SYM;
  } else {
    h->trivial_symbol_ =
        ((uint32_t)alpha_sym << 24) | (red_sym << 16) | (blue_sym << 0);
  }
}